

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_> __thiscall
Parser::parseFunctionCallStatement(Parser *this,optional<Token> *identifierToken)

{
  Mark MVar1;
  Mark *pMVar2;
  istream *piVar3;
  TokenType *in_RDX;
  bool bVar4;
  undefined1 local_90 [8];
  undefined1 local_88 [32];
  undefined1 local_68 [56];
  bool local_30;
  
  pMVar2 = Stream::getMark((Stream *)identifierToken);
  MVar1 = *pMVar2;
  local_30 = false;
  bVar4 = (char)in_RDX[0xe] == KeywordIf;
  if (bVar4) {
    local_68._0_4_ = *in_RDX;
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)(local_68 + 8),
                      (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)(in_RDX + 2));
    local_68._48_8_ = *(Mark *)(in_RDX + 0xc);
  }
  local_30 = bVar4;
  parseFunctionCall((Parser *)local_90,identifierToken);
  if (local_30 == true) {
    std::_Optional_payload_base<Token>::_M_destroy((_Optional_payload_base<Token> *)local_68);
  }
  local_88._0_8_ = (long)local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Expected semicolon!","");
  expectToken((Parser *)identifierToken,Semicolon,(string *)local_88);
  if (local_88._0_8_ != (long)local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  piVar3 = (istream *)operator_new(0x18);
  *(undefined ***)piVar3 = &PTR__FunctionCallStatementNode_001508e8;
  *(undefined1 (*) [8])(piVar3 + 0x10) = local_90;
  (this->tokenizer_).stream_.is_ = piVar3;
  *(Mark *)(piVar3 + 8) = MVar1;
  return (__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
          )(__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCallStatementNode> Parser::parseFunctionCallStatement(std::optional<Token> identifierToken)
{
  const auto mark = tokenizer_.getMark();
  auto functionCall = parseFunctionCall(identifierToken);
  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<FunctionCallStatementNode>(std::move(functionCall));
  node->setMark(mark);
  return node;
}